

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O0

int Silent_WideCharToMultiByte
              (LPCWSTR lpWideCharStr,int cchWideChar,LPSTR lpMultiByteStr,int cbMultiByte)

{
  size_t sVar1;
  int local_28;
  INT retval;
  int cbMultiByte_local;
  LPSTR lpMultiByteStr_local;
  LPCWSTR pWStack_10;
  int cchWideChar_local;
  LPCWSTR lpWideCharStr_local;
  
  local_28 = 0;
  if ((lpWideCharStr != (LPCWSTR)0x0) && (lpWideCharStr != (LPCWSTR)lpMultiByteStr)) {
    lpMultiByteStr_local._4_4_ = cchWideChar;
    if (cchWideChar == -1) {
      sVar1 = Silent_PAL_wcslen(lpWideCharStr);
      lpMultiByteStr_local._4_4_ = (int)sVar1 + 1;
    }
    if (cbMultiByte == 0) {
      local_28 = lpMultiByteStr_local._4_4_;
    }
    else if (cbMultiByte < lpMultiByteStr_local._4_4_) {
      local_28 = 0;
    }
    else {
      local_28 = lpMultiByteStr_local._4_4_;
      _retval = lpMultiByteStr;
      pWStack_10 = lpWideCharStr;
      for (; 0 < lpMultiByteStr_local._4_4_;
          lpMultiByteStr_local._4_4_ = lpMultiByteStr_local._4_4_ + -1) {
        if ((ushort)*pWStack_10 < 0x100) {
          *_retval = (CHAR)*pWStack_10;
        }
        else {
          *_retval = '?';
        }
        _retval = _retval + 1;
        pWStack_10 = pWStack_10 + 1;
      }
    }
  }
  return local_28;
}

Assistant:

int Silent_WideCharToMultiByte(LPCWSTR lpWideCharStr, int cchWideChar,
                               LPSTR lpMultiByteStr, int cbMultiByte)
{
    INT retval =0;

    if ((lpWideCharStr == NULL)||
        (lpWideCharStr == (LPCWSTR) lpMultiByteStr))
    {
        goto EXIT;
    }

    if (cchWideChar == -1)
    {
        cchWideChar = Silent_PAL_wcslen(lpWideCharStr) + 1;
    }

    if (cbMultiByte == 0)
    {
        retval = cchWideChar;
        goto EXIT;
    }
    else if(cbMultiByte < cchWideChar)
    {
        retval = 0;
        goto EXIT;
    }
    
    retval = cchWideChar;
    while(cchWideChar > 0)
    {
        if(*lpWideCharStr > 255)
        {
            *lpMultiByteStr = '?';
        }
        else
        {
            *lpMultiByteStr = (unsigned char)*lpWideCharStr;
        }
        lpMultiByteStr++;
        lpWideCharStr++;
        cchWideChar--;
    }

EXIT:
    return retval;
}